

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O0

void my_create_demon(Am_Object *self)

{
  Am_Object_Demon *pAVar1;
  ostream *poVar2;
  Am_Object local_20;
  char local_11;
  Am_Object *pAStack_10;
  char c;
  Am_Object *self_local;
  
  pAStack_10 = self;
  if (proto_create != (Am_Object_Demon *)0x0) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,proto_create != (Am_Object_Demon *)0x0);
    poVar2 = std::operator<<(poVar2,"Id the fn ptr\n");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,&local_11);
    pAVar1 = proto_create;
    Am_Object::Am_Object(&local_20,self);
    (*pAVar1)((Am_Object_Data *)&local_20);
    Am_Object::~Am_Object(&local_20);
  }
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,self);
  std::operator<<(poVar2," was created!!\n");
  return;
}

Assistant:

void
my_create_demon(Am_Object self)
{
  if (proto_create != nullptr) {
    char c;
    cout << proto_create << "Id the fn ptr\n" << flush;
    cin >> c;
    proto_create(self); // Call prototype create demon.
  }
  // Do my own code.
  cout << self << " was created!!\n";
}